

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

HANDLE CreateEventW(LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,BOOL bInitialState,
                   LPCWSTR lpName)

{
  PAL_ERROR dwLastError;
  CPalThread *pthr_00;
  CPalThread *pthr;
  HANDLE pVStack_28;
  PAL_ERROR palError;
  HANDLE hEvent;
  LPCWSTR lpName_local;
  BOOL bInitialState_local;
  BOOL bManualReset_local;
  LPSECURITY_ATTRIBUTES lpEventAttributes_local;
  
  pVStack_28 = (HANDLE)0x0;
  hEvent = lpName;
  lpName_local._0_4_ = bInitialState;
  lpName_local._4_4_ = bManualReset;
  _bInitialState_local = lpEventAttributes;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pthr_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalCreateEvent
                          (pthr_00,_bInitialState_local,lpName_local._4_4_,(BOOL)lpName_local,
                           (LPCWSTR)hEvent,&stack0xffffffffffffffd8);
  CorUnix::CPalThread::SetLastError(dwLastError);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pVStack_28;
}

Assistant:

HANDLE
PALAPI
CreateEventW(
         IN LPSECURITY_ATTRIBUTES lpEventAttributes,
         IN BOOL bManualReset,
         IN BOOL bInitialState,
         IN LPCWSTR lpName)
{
    HANDLE hEvent = NULL;
    PAL_ERROR palError;
    CPalThread *pthr = NULL;

    PERF_ENTRY(CreateEventW);
    ENTRY("CreateEventW(lpEventAttr=%p, bManualReset=%d, "
          "bInitialState=%d, lpName=%p (%S)\n", lpEventAttributes, bManualReset, 
           bInitialState, lpName, lpName?lpName:W16_NULLSTRING);

    pthr = InternalGetCurrentThread();

    palError = InternalCreateEvent(
        pthr,
        lpEventAttributes, 
        bManualReset,
        bInitialState,
        lpName,
        &hEvent
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);

    LOGEXIT("CreateEventW returns HANDLE %p\n", hEvent);
    PERF_EXIT(CreateEventW);
    return hEvent;
}